

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContinuumMaterial.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChContinuumPlasticVonMises::ArchiveIN
          (ChContinuumPlasticVonMises *this,ChArchiveIn *marchive)

{
  char *local_38;
  double *local_30;
  undefined1 local_28;
  
  ChArchiveIn::VersionRead<chrono::fea::ChContinuumPlasticVonMises>(marchive);
  ChArchiveIn::VersionRead<chrono::fea::ChContinuumElastoplastic>(marchive);
  ChContinuumElastic::ArchiveIN((ChContinuumElastic *)this,marchive);
  local_30 = &this->elastic_yeld;
  local_38 = "this->elastic_yeld";
  local_28 = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_38);
  local_30 = &this->plastic_yeld;
  local_38 = "this->plastic_yeld";
  local_28 = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_38);
  local_30 = &this->flow_rate;
  local_38 = "this->flow_rate";
  local_28 = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_38);
  return;
}

Assistant:

void ChContinuumPlasticVonMises::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChContinuumPlasticVonMises>();
    // deserialize parent class
    ChContinuumElastoplastic::ArchiveIN(marchive);
    // stream in all member data:
    marchive >> CHNVP(this->elastic_yeld);
    marchive >> CHNVP(this->plastic_yeld);
    marchive >> CHNVP(this->flow_rate);
}